

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

int __thiscall QDir::remove(QDir *this,char *__filename)

{
  int iVar1;
  long in_FS_OFFSET;
  QMessageLogger local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(__filename + 0x10) == 0) {
    local_30.context.version = 2;
    local_30.context.function._4_4_ = 0;
    local_30.context._4_8_ = 0;
    local_30.context._12_8_ = 0;
    local_30.context.category = "default";
    iVar1 = 0;
    QMessageLogger::warning(&local_30,"QDir::remove: Empty or null file name");
  }
  else {
    filePath((QString *)&local_30,this,(QString *)__filename);
    iVar1 = QFile::remove((char *)&local_30);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::remove(const QString &fileName)
{
    if (fileName.isEmpty()) {
        qWarning("QDir::remove: Empty or null file name");
        return false;
    }
    return QFile::remove(filePath(fileName));
}